

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

int mp_check(char **data,char *end)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  mp_check_error err;
  
  pbVar3 = (byte *)*data;
  lVar9 = 1;
  err.pos = (char *)pbVar3;
  while( true ) {
    if (lVar9 < 1) {
      if (err.pos <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xd35,"int mp_check(const char **, const char *)");
    }
    if (err.pos == end) break;
    bVar7 = *err.pos;
    pbVar6 = (byte *)err.pos + 1;
    *data = (char *)pbVar6;
    bVar1 = ""[bVar7];
    uVar8 = (uint)(char)bVar1;
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xe1) {
        switch(bVar1) {
        case 0xd6:
          err.type = MP_CHECK_ERROR_ILL;
          goto LAB_0012a243;
        case 0xd7:
          if (4 < (ulong)((long)end - (long)pbVar6)) {
            uVar8 = *(uint *)((byte *)err.pos + 1);
            uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
            bVar7 = ((byte *)err.pos)[5];
            pbVar6 = (byte *)err.pos + 6;
            *data = (char *)pbVar6;
            if ((ulong)uVar8 <= (ulong)((long)end - (long)pbVar6)) {
              iVar4 = (*mp_check_ext_data)(bVar7,(char *)pbVar6,uVar8);
              if (iVar4 != 0) {
                err.type = MP_CHECK_ERROR_EXT;
                err.pos = *data;
                err.ext_type = bVar7;
                err.ext_len = uVar8;
                goto LAB_0012a243;
              }
              err.pos = *data + uVar8;
LAB_0012a202:
              *data = err.pos;
              goto LAB_00129fb4;
            }
          }
          break;
        case 0xd8:
          if (2 < (ulong)((long)end - (long)pbVar6)) {
            uVar2 = *(ushort *)((byte *)err.pos + 1);
            bVar7 = ((byte *)err.pos)[3];
            pbVar6 = (byte *)err.pos + 4;
            *data = (char *)pbVar6;
            uVar5 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
            if (uVar5 <= (ulong)((long)end - (long)pbVar6)) {
LAB_0012a116:
              iVar4 = (*mp_check_ext_data)(bVar7,(char *)pbVar6,(uint32_t)uVar5);
              if (iVar4 != 0) {
                err.type = MP_CHECK_ERROR_EXT;
                err.pos = *data;
                err.ext_type = bVar7;
                err.ext_len = (uint32_t)uVar5;
                goto LAB_0012a243;
              }
              err.pos = *data + uVar5;
              goto LAB_0012a202;
            }
          }
          break;
        case 0xd9:
          if (1 < (ulong)((long)end - (long)pbVar6)) {
            uVar5 = (ulong)((byte *)err.pos)[1];
            bVar7 = ((byte *)err.pos)[2];
            pbVar6 = (byte *)err.pos + 3;
            *data = (char *)pbVar6;
            if (uVar5 <= (ulong)((long)end - (long)pbVar6)) goto LAB_0012a116;
          }
          break;
        case 0xda:
          if (3 < (ulong)((long)end - (long)pbVar6)) {
            uVar8 = *(uint *)((byte *)err.pos + 1);
            uVar5 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                           uVar8 << 0x18);
            err.pos = (char *)((byte *)err.pos + 5);
            *data = err.pos;
LAB_0012a15b:
            uVar5 = uVar5 * 2;
LAB_0012a1a5:
            lVar9 = lVar9 + uVar5;
            goto LAB_00129fb4;
          }
          break;
        case 0xdb:
          if (1 < (ulong)((long)end - (long)pbVar6)) {
            uVar2 = *(ushort *)((byte *)err.pos + 1);
            err.pos = (char *)((byte *)err.pos + 3);
            *data = err.pos;
            uVar5 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
            goto LAB_0012a15b;
          }
          break;
        case 0xdc:
          if (3 < (ulong)((long)end - (long)pbVar6)) {
            uVar8 = *(uint *)((byte *)err.pos + 1);
            uVar5 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                           uVar8 << 0x18);
            err.pos = (char *)((byte *)err.pos + 5);
            *data = err.pos;
            goto LAB_0012a1a5;
          }
          break;
        case 0xdd:
          if (1 < (ulong)((long)end - (long)pbVar6)) {
            uVar2 = *(ushort *)((byte *)err.pos + 1);
            err.pos = (char *)((byte *)err.pos + 3);
            *data = err.pos;
            uVar5 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
            goto LAB_0012a1a5;
          }
          break;
        case 0xde:
          if (3 < (ulong)((long)end - (long)pbVar6)) {
            uVar8 = *(uint *)((byte *)err.pos + 1);
            uVar5 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                           uVar8 << 0x18);
            pbVar6 = (byte *)err.pos + 5;
LAB_0012a1c3:
            *data = (char *)pbVar6;
LAB_0012a1f6:
            if (uVar5 <= (ulong)((long)end - (long)pbVar6)) {
              err.pos = (char *)(pbVar6 + uVar5);
              goto LAB_0012a202;
            }
          }
          break;
        case 0xdf:
          if (1 < (ulong)((long)end - (long)pbVar6)) {
            uVar2 = *(ushort *)((byte *)err.pos + 1);
            pbVar6 = (byte *)err.pos + 3;
            *data = (char *)pbVar6;
            uVar5 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
            goto LAB_0012a1f6;
          }
          break;
        case 0xe0:
          if (pbVar6 != (byte *)end) {
            uVar5 = (ulong)((byte *)err.pos)[1];
            pbVar6 = (byte *)err.pos + 2;
            goto LAB_0012a1c3;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                        ,0xd31,"int mp_check(const char **, const char *)");
        }
        break;
      }
      lVar9 = lVar9 - (int)uVar8;
      err.pos = (char *)pbVar6;
    }
    else {
      if ((ulong)((long)end - (long)pbVar6) < (ulong)uVar8) break;
      if ((byte)(bVar7 + 0x2c) < 5) {
        uVar8 = uVar8 - 1;
        bVar7 = ((byte *)err.pos)[1];
        *data = (char *)((byte *)err.pos + 2);
        iVar4 = (*mp_check_ext_data)(bVar7,(char *)((byte *)err.pos + 2),uVar8);
        if (iVar4 != 0) {
          err.type = MP_CHECK_ERROR_EXT;
          err.pos = *data;
          err.ext_type = bVar7;
          err.ext_len = uVar8;
          goto LAB_0012a243;
        }
        err.pos = *data + uVar8;
      }
      else {
        err.pos = (char *)(pbVar6 + uVar8);
      }
      *data = err.pos;
    }
LAB_00129fb4:
    lVar9 = lVar9 + -1;
  }
  err.type = MP_CHECK_ERROR_TRUNC;
  err.trunc_count = lVar9;
LAB_0012a243:
  err.data = (char *)pbVar3;
  err.end = end;
  (*mp_check_on_error)(&err);
  return 1;
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
	const char *begin = *data;

#define MP_CHECK_LEN(_l)						\
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) {	\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_TRUNC;			\
		err.data = begin;					\
		err.end = end;						\
		err.pos = pos;						\
		err.trunc_count = k;					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

#define MP_CHECK_EXT(_type, _data, _len)				\
	if (mp_check_ext_data((_type), (_data), (_len)) != 0) {		\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_EXT;				\
		err.data = begin;					\
		err.end = end;						\
		err.pos = (_data);					\
		err.ext_type = (_type);					\
		err.ext_len = (_len);					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

	int64_t k;
	for (k = 1; k > 0; k--) {
		const char *pos = *data;
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		uint32_t len;
		int8_t type;
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			if (mp_unlikely(c >= 0xd4 && c <= 0xd8)) {
				/*
				 * Check MP_EXT contents. Everything but the
				 * first byte (which stands for ext type) is the
				 * payload.
				 */
				len = l - 1;
				type = mp_load_u8(data);
				MP_CHECK_EXT(type, *data, len);
				*data += len;
			} else {
				*data += l;
			}
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_INVALID:
		{
			struct mp_check_error err;
			err.type = MP_CHECK_ERROR_ILL;
			err.data = begin;
			err.end = end;
			err.pos = pos;
			mp_check_on_error(&err);
			return 1;
		}
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
#undef MP_CHECK_EXT
	return 0;
}